

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

int __thiscall OpenMD::SimInfo::getFdf(SimInfo *this)

{
  this->fdf_ = this->fdf_local;
  return this->fdf_local;
}

Assistant:

int SimInfo::getFdf() {
#ifdef IS_MPI
    MPI_Allreduce(&fdf_local, &fdf_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#else
    fdf_                       = fdf_local;
#endif
    return fdf_;
  }